

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

double __thiscall pstore::basic_logger::log(basic_logger *this,double __x)

{
  time_t t;
  size_t sVar1;
  ostream *poVar2;
  czstring pcVar3;
  string *in_RDX;
  priority in_ESI;
  double dVar4;
  string asStack_1d8 [39];
  array<char,_25UL> time_buffer;
  ostringstream str;
  
  t = time((time_t *)0x0);
  _str = &time_buffer;
  sVar1 = time_string(t,(span<char,_25L> *)&str);
  if (sVar1 == 0x18) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    poVar2 = std::operator<<((ostream *)&str,time_buffer._M_elems);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,(string *)&this->thread_name_);
    poVar2 = std::operator<<(poVar2," - ");
    pcVar3 = priority_string(in_ESI);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," - ");
    poVar2 = std::operator<<(poVar2,in_RDX);
    std::operator<<(poVar2,'\n');
    std::mutex::lock((mutex *)mutex_);
    std::__cxx11::stringbuf::str();
    (*(this->super_logger)._vptr_logger[0xc])(this,asStack_1d8);
    std::__cxx11::string::~string(asStack_1d8);
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    dVar4 = (double)std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    return dVar4;
  }
  assert_failed("r == sizeof (time_buffer) - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/logging.cpp"
                ,0x162);
}

Assistant:

void basic_logger::log (priority const p, std::string const & message) {
            std::array<char, time_buffer_size> time_buffer;
            std::size_t const r = time_string (std::time (nullptr), ::gsl::make_span (time_buffer));
            (void) r;
            PSTORE_ASSERT (r == sizeof (time_buffer) - 1);
            gsl::czstring const time_str = time_buffer.data ();
            std::ostringstream str;
            str << time_str << " - " << thread_name_ << " - " << priority_string (p) << " - "
                << message << '\n';

            std::lock_guard<std::mutex> const lock (mutex_);
            this->log_impl (str.str ());
        }